

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::CircularArrayTest::AssertCircularArrayEq<4ul>
          (CircularArrayTest *this,CircularArray<(anonymous_namespace)::TestObject,_4UL> *ca,
          vector<int,_std::allocator<int>_> *expected)

{
  long lVar1;
  internal iVar2;
  int line;
  size_t i;
  ulong uVar3;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  char *in_R9;
  long lVar5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  AssertHelper local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  AssertHelper local_38;
  
  lVar5 = *(long *)(ca->contents_)._M_elems;
  lVar1 = *(long *)&(ca->contents_)._M_elems[0].moved;
  if (lVar5 == lVar1) {
    local_60.data_ = local_60.data_ & 0xffffffff00000000;
    local_70._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0x30);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_58,"0U","ca.size()",(uint *)&local_60,(unsigned_long *)&local_70);
    iVar2 = local_58[0];
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-circular-array.cc"
                 ,0x5a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_70._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    if (iVar2 != (internal)0x0) {
      local_70._M_head_impl._0_1_ = *(long *)(this + 0x30) == 0;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (*(long *)(this + 0x30) != 0) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_58,(internal *)&local_70,(AssertionResult *)"ca.empty()","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-circular-array.cc"
                   ,0x5b,(char *)CONCAT71(local_58._1_7_,local_58[0]));
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_58._1_7_,local_58[0]),local_48._M_allocated_capacity + 1
                         );
        }
        if (local_60.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68;
        local_50 = local_68;
LAB_00143e3a:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(this_00,local_50);
      }
    }
  }
  else {
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (lVar1 - lVar5 >> 2);
    local_60.data_ = *(AssertHelperData **)(this + 0x30);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_58,"expected.size()","ca.size()",(unsigned_long *)&local_70,
               (unsigned_long *)&local_60);
    iVar2 = local_58[0];
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-circular-array.cc"
                 ,0x5d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_70._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    if (iVar2 != (internal)0x0) {
      lVar5 = *(long *)(this + 0x30);
      local_70._M_head_impl._0_1_ = lVar5 != 0;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (lVar5 == 0) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_58,(internal *)&local_70,(AssertionResult *)"ca.empty()","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-circular-array.cc"
                   ,0x5e,(char *)CONCAT71(local_58._1_7_,local_58[0]));
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_58._1_7_,local_58[0]),local_48._M_allocated_capacity + 1
                         );
        }
        if (local_60.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
      if (lVar5 != 0) {
        if (*(long *)(this + 0x30) == 0) {
LAB_001440f3:
          __assert_fail("index < size_",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/circular-array.h"
                        ,0x39,
                        "const_reference wabt::CircularArray<(anonymous namespace)::TestObject, 4>::at(size_type) const [T = (anonymous namespace)::TestObject, kCapacity = 4]"
                       );
        }
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_58,"expected.front()","ca.front().data",
                   *(int **)(ca->contents_)._M_elems,
                   (int *)(this + (ulong)((uint)*(undefined8 *)(this + 0x38) & 3) * 0xc));
        iVar2 = local_58[0];
        if (local_58[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_70);
          if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_50->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-circular-array.cc"
                     ,0x60,pcVar4);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (local_70._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_70._M_head_impl + 8))();
          }
        }
        if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_50,local_50);
        }
        if (iVar2 != (internal)0x0) {
          if (*(long *)(this + 0x30) == 0) goto LAB_001440f3;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_58,"expected.back()","ca.back().data",
                     (int *)(*(long *)&(ca->contents_)._M_elems[0].moved + -4),
                     (int *)(this + (ulong)(((int)*(long *)(this + 0x30) + *(int *)(this + 0x38)) -
                                            1U & 3) * 0xc));
          iVar2 = local_58[0];
          if (local_58[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_70);
            if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (local_50->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-circular-array.cc"
                       ,0x61,pcVar4);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            if (local_70._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_70._M_head_impl + 8))();
            }
          }
          if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_50,local_50);
          }
          if ((iVar2 != (internal)0x0) && (*(long *)(this + 0x30) != 0)) {
            lVar5 = 0;
            uVar3 = 0;
            do {
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_58,"expected[i]","ca.at(i).data",
                         (int *)(*(long *)(ca->contents_)._M_elems + lVar5),
                         (int *)(this + (ulong)(*(int *)(this + 0x38) + (int)uVar3 & 3) * 0xc));
              if (local_58[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_70);
                if (local_50 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = (local_50->_M_dataplus)._M_p;
                }
                line = 100;
LAB_001440a5:
                testing::internal::AssertHelper::AssertHelper
                          (&local_60,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-circular-array.cc"
                           ,line,pcVar4);
                testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
                testing::internal::AssertHelper::~AssertHelper(&local_60);
                if (local_70._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_70._M_head_impl + 8))();
                }
                if (local_50 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  return;
                }
                this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_50;
                goto LAB_00143e3a;
              }
              if (local_50 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_50,local_50);
              }
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_58,"expected[i]","ca[i].data",
                         (int *)(*(long *)(ca->contents_)._M_elems + lVar5),
                         (int *)(this + (ulong)(*(int *)(this + 0x38) + (int)uVar3 & 3) * 0xc));
              if (local_58[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_70);
                if (local_50 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = (local_50->_M_dataplus)._M_p;
                }
                line = 0x65;
                goto LAB_001440a5;
              }
              if (local_50 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_50,local_50);
              }
              uVar3 = uVar3 + 1;
              lVar5 = lVar5 + 4;
            } while (uVar3 < *(ulong *)(this + 0x30));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void AssertCircularArrayEq(const CircularArray<TestObject, N>& ca,
                             const std::vector<int>& expected) {
    if (expected.empty()) {
      ASSERT_EQ(0U, ca.size());
      ASSERT_TRUE(ca.empty());
    } else {
      ASSERT_EQ(expected.size(), ca.size());
      ASSERT_FALSE(ca.empty());

      ASSERT_EQ(expected.front(), ca.front().data);
      ASSERT_EQ(expected.back(), ca.back().data);

      for (size_t i = 0; i < ca.size(); ++i) {
        ASSERT_EQ(expected[i], ca.at(i).data);
        ASSERT_EQ(expected[i], ca[i].data);
      }
    }
  }